

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O2

void __thiscall
AbstractTransaction_TxSizeByException_Test::TestBody
          (AbstractTransaction_TxSizeByException_Test *this)

{
  char *pcVar1;
  AssertHelper local_38;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertionResult gtest_ar;
  TestTransaction tx;
  
  TestTransaction::TestTransaction((TestTransaction *)&tx.super_AbstractTransaction);
  local_30.ptr_._0_4_ = cfd::core::AbstractTransaction::GetTotalSize(&tx.super_AbstractTransaction);
  local_38.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetTotalSize()","10",(uint *)&local_30,(int *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x13d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_30.ptr_._0_4_ = cfd::core::AbstractTransaction::GetVsize(&tx.super_AbstractTransaction);
  local_38.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetVsize()","10",(uint *)&local_30,(int *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x13e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_30.ptr_._0_4_ = cfd::core::AbstractTransaction::GetWeight(&tx.super_AbstractTransaction);
  local_38.data_._0_4_ = 0x28;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetWeight()","40",(uint *)&local_30,(int *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x13f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTransaction::~AbstractTransaction(&tx.super_AbstractTransaction);
  return;
}

Assistant:

TEST(AbstractTransaction, TxSizeByException) {
  TestTransaction tx;
  EXPECT_EQ(tx.GetTotalSize(), 10);
  EXPECT_EQ(tx.GetVsize(), 10);
  EXPECT_EQ(tx.GetWeight(), 40);
}